

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn_test.cc
# Opt level: O0

void anon_unknown.dwarf_30f402::CNNTest::RunMultiOutCNNTest
               (float **input,int image_width,int image_height,int in_stride,CNN_CONFIG *cnn_config,
               CNN_THREAD_DATA *thread_data,CNN_MULTI_OUT *output,float **expected,double tolerance)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  void *pvVar4;
  void *pvVar5;
  char (*in_stack_00000008) [10];
  long in_stack_00000010;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  int i;
  float *buf_out;
  int channel;
  int expected_ite;
  double mse;
  int out_size;
  int curr_output_chs;
  float *expected_out;
  int output_idx;
  int channel_offset;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int *not_used;
  int *out_heights;
  int *out_widths;
  int *output_chs;
  int num_outputs;
  CNN_THREAD_DATA *in_stack_00003f10;
  CNN_CONFIG *in_stack_00003f18;
  int in_stack_00003f24;
  int in_stack_00003f28;
  int in_stack_00003f2c;
  float **in_stack_00003f30;
  CNN_MULTI_OUT *in_stack_00003f40;
  char (*val) [10];
  AssertionResult *in_stack_fffffffffffffdb0;
  int **in_stack_fffffffffffffdb8;
  Message *in_stack_fffffffffffffdc0;
  Message *in_stack_fffffffffffffdc8;
  Message *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdd8;
  AssertHelper *in_stack_fffffffffffffde0;
  int *in_stack_fffffffffffffe00;
  int *in_stack_fffffffffffffe08;
  int *in_stack_fffffffffffffe10;
  CNN_CONFIG *in_stack_fffffffffffffe18;
  char *in_stack_fffffffffffffe20;
  AssertionResult *in_stack_fffffffffffffe28;
  AssertHelper *in_stack_fffffffffffffe30;
  AssertionResult local_1a0;
  int local_184;
  AssertionResult local_178;
  int local_164;
  long local_160;
  int local_158;
  int local_154;
  double local_150;
  int local_148;
  int local_144;
  long local_140;
  int local_138;
  int local_134;
  string local_130 [55];
  undefined1 local_f9;
  AssertionResult local_f8 [2];
  undefined8 local_d8;
  AssertionResult local_d0 [2];
  undefined8 local_b0;
  AssertionResult local_a8;
  uint local_94;
  double in_stack_ffffffffffffff70;
  double in_stack_ffffffffffffff78;
  double in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  char *expr2;
  char *in_stack_ffffffffffffff98;
  
  iVar1 = *(int *)*in_stack_00000008;
  lVar2 = *(long *)(*in_stack_00000008 + 8);
  pvVar4 = aom_calloc((size_t)in_stack_fffffffffffffdb8,(size_t)in_stack_fffffffffffffdb0);
  pvVar5 = aom_calloc((size_t)in_stack_fffffffffffffdb8,(size_t)in_stack_fffffffffffffdb0);
  aom_calloc((size_t)in_stack_fffffffffffffdb8,(size_t)in_stack_fffffffffffffdb0);
  expr2 = (char *)0x0;
  testing::internal::CmpHelperNE<int*,decltype(nullptr)>
            ((char *)in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0,
             in_stack_fffffffffffffdb8,(void **)in_stack_fffffffffffffdb0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff98);
  if (!bVar3) {
    testing::Message::Message((Message *)in_stack_fffffffffffffde0);
    testing::AssertionResult::failure_message((AssertionResult *)0x4eacbb);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffde0,(Type)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
               (char *)in_stack_fffffffffffffdd0,(int)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
               (char *)in_stack_fffffffffffffdc0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffe30,(Message *)in_stack_fffffffffffffe28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdb0);
    testing::Message::~Message((Message *)0x4ead1e);
  }
  local_94 = (uint)!bVar3;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x4eada2);
  if (local_94 == 0) {
    local_b0 = 0;
    testing::internal::CmpHelperNE<int*,decltype(nullptr)>
              ((char *)in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0,
               in_stack_fffffffffffffdb8,(void **)in_stack_fffffffffffffdb0);
    bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_a8);
    if (!bVar3) {
      testing::Message::Message((Message *)in_stack_fffffffffffffde0);
      testing::AssertionResult::failure_message((AssertionResult *)0x4eae31);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffde0,(Type)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
                 (char *)in_stack_fffffffffffffdd0,(int)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
                 (char *)in_stack_fffffffffffffdc0);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffe30,(Message *)in_stack_fffffffffffffe28);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdb0);
      testing::Message::~Message((Message *)0x4eae94);
    }
    local_94 = (uint)!bVar3;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x4eaf18);
    if (local_94 == 0) {
      local_d8 = 0;
      testing::internal::CmpHelperNE<int*,decltype(nullptr)>
                ((char *)in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0,
                 in_stack_fffffffffffffdb8,(void **)in_stack_fffffffffffffdb0);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(local_d0);
      if (!bVar3) {
        testing::Message::Message((Message *)in_stack_fffffffffffffde0);
        testing::AssertionResult::failure_message((AssertionResult *)0x4eafa7);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffde0,(Type)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
                   (char *)in_stack_fffffffffffffdd0,(int)((ulong)in_stack_fffffffffffffdc8 >> 0x20)
                   ,(char *)in_stack_fffffffffffffdc0);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffe30,(Message *)in_stack_fffffffffffffe28);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdb0);
        testing::Message::~Message((Message *)0x4eb00a);
      }
      local_94 = (uint)!bVar3;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x4eb091);
      if (local_94 == 0) {
        av1_find_cnn_output_size
                  ((int)((ulong)in_stack_fffffffffffffe20 >> 0x20),(int)in_stack_fffffffffffffe20,
                   in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                   in_stack_fffffffffffffe00);
        val = in_stack_00000008;
        local_f9 = av1_cnn_predict_c(in_stack_00003f30,in_stack_00003f2c,in_stack_00003f28,
                                     in_stack_00003f24,in_stack_00003f18,in_stack_00003f10,
                                     in_stack_00003f40);
        testing::AssertionResult::AssertionResult<bool>
                  (in_stack_fffffffffffffdb0,(bool *)val,(type *)0x4eb136);
        bVar3 = testing::AssertionResult::operator_cast_to_bool(local_f8);
        if (!bVar3) {
          testing::Message::Message((Message *)in_stack_fffffffffffffde0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                     (char *)in_stack_fffffffffffffe18,(char *)in_stack_fffffffffffffe10);
          std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (in_stack_fffffffffffffde0,(Type)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
                     (char *)in_stack_fffffffffffffdd0,
                     (int)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
                     (char *)in_stack_fffffffffffffdc0);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffe30,(Message *)in_stack_fffffffffffffe28);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffdb0);
          std::__cxx11::string::~string(local_130);
          testing::Message::~Message((Message *)0x4eb209);
        }
        local_94 = (uint)!bVar3;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x4eb2b6);
        if (local_94 == 0) {
          local_134 = 0;
          for (local_138 = 0; local_138 < iVar1; local_138 = local_138 + 1) {
            local_140 = *(long *)(in_stack_00000010 + (long)local_138 * 8);
            local_144 = *(int *)(lVar2 + (long)local_138 * 4);
            local_148 = *(int *)((long)pvVar4 + (long)local_138 * 4) *
                        *(int *)((long)pvVar5 + (long)local_138 * 4);
            local_150 = 0.0;
            local_154 = 0;
            for (local_158 = 0; local_158 < local_144; local_158 = local_158 + 1) {
              local_160 = *(long *)(*(long *)((long)(in_stack_00000008 + 2) + 4) +
                                   (long)local_134 * 8);
              for (local_164 = 0; local_164 < local_148; local_164 = local_164 + 1) {
                testing::internal::DoubleNearPredFormat
                          (in_stack_ffffffffffffff98,expr2,in_stack_ffffffffffffff88,
                           in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                           in_stack_ffffffffffffff70);
                bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_178);
                if (!bVar3) {
                  testing::Message::Message((Message *)in_stack_fffffffffffffde0);
                  in_stack_fffffffffffffe30 =
                       (AssertHelper *)
                       testing::Message::operator<<
                                 ((Message *)in_stack_fffffffffffffdb0,(char (*) [9])val);
                  in_stack_fffffffffffffe28 =
                       (AssertionResult *)
                       testing::Message::operator<<((Message *)in_stack_fffffffffffffdb0,(int *)val)
                  ;
                  testing::Message::operator<<((Message *)in_stack_fffffffffffffdb0,val);
                  testing::Message::operator<<((Message *)in_stack_fffffffffffffdb0,(int *)val);
                  testing::Message::operator<<
                            ((Message *)in_stack_fffffffffffffdb0,(char (*) [8])val);
                  local_184 = local_154 % local_148;
                  testing::Message::operator<<((Message *)in_stack_fffffffffffffdb0,(int *)val);
                  testing::Message::operator<<
                            ((Message *)in_stack_fffffffffffffdb0,(char (*) [3])val);
                  testing::Message::operator<<((Message *)in_stack_fffffffffffffdb0,(float *)val);
                  testing::Message::operator<<
                            ((Message *)in_stack_fffffffffffffdb0,(char (*) [2])val);
                  testing::Message::operator<<((Message *)in_stack_fffffffffffffdb0,(float *)val);
                  in_stack_fffffffffffffde0 =
                       (AssertHelper *)
                       testing::Message::operator<<
                                 ((Message *)in_stack_fffffffffffffdb0,(BasicNarrowIoManip)val);
                  in_stack_fffffffffffffdd8 =
                       testing::AssertionResult::failure_message((AssertionResult *)0x4eb5b9);
                  testing::internal::AssertHelper::AssertHelper
                            (in_stack_fffffffffffffde0,
                             (Type)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
                             (char *)in_stack_fffffffffffffdd0,
                             (int)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
                             (char *)in_stack_fffffffffffffdc0);
                  testing::internal::AssertHelper::operator=
                            (in_stack_fffffffffffffe30,(Message *)in_stack_fffffffffffffe28);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)in_stack_fffffffffffffdb0);
                  testing::Message::~Message((Message *)0x4eb613);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)0x4eb684);
                local_150 = (double)((*(float *)(local_140 + (long)local_154 * 4) -
                                     *(float *)(local_160 + (long)local_164 * 4)) *
                                    (*(float *)(local_140 + (long)local_154 * 4) -
                                    *(float *)(local_160 + (long)local_164 * 4))) + local_150;
                local_154 = local_154 + 1;
              }
              local_134 = local_134 + 1;
            }
            local_150 = local_150 / (double)(local_148 * local_144);
            testing::internal::CmpHelperLE<double,double>
                      ((char *)in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0,
                       (double *)in_stack_fffffffffffffdb8,(double *)in_stack_fffffffffffffdb0);
            bVar3 = testing::AssertionResult::operator_cast_to_bool(&local_1a0);
            if (!bVar3) {
              testing::Message::Message((Message *)in_stack_fffffffffffffde0);
              in_stack_fffffffffffffdd0 =
                   testing::Message::operator<<
                             ((Message *)in_stack_fffffffffffffdb0,(char (*) [9])val);
              in_stack_fffffffffffffdc8 =
                   testing::Message::operator<<((Message *)in_stack_fffffffffffffdb0,(int *)val);
              in_stack_fffffffffffffdc0 =
                   testing::Message::operator<<
                             ((Message *)in_stack_fffffffffffffdb0,(BasicNarrowIoManip)val);
              in_stack_fffffffffffffdb8 =
                   (int **)testing::AssertionResult::failure_message((AssertionResult *)0x4eb826);
              testing::internal::AssertHelper::AssertHelper
                        (in_stack_fffffffffffffde0,(Type)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
                         (char *)in_stack_fffffffffffffdd0,
                         (int)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
                         (char *)in_stack_fffffffffffffdc0);
              testing::internal::AssertHelper::operator=
                        (in_stack_fffffffffffffe30,(Message *)in_stack_fffffffffffffe28);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)in_stack_fffffffffffffdb0);
              testing::Message::~Message((Message *)0x4eb880);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x4eb8eb);
          }
          aom_free(in_stack_fffffffffffffdb0);
          aom_free(in_stack_fffffffffffffdb0);
          aom_free(in_stack_fffffffffffffdb0);
        }
      }
    }
  }
  return;
}

Assistant:

static void RunMultiOutCNNTest(const float **input, int image_width,
                                 int image_height, int in_stride,
                                 const CNN_CONFIG *cnn_config,
                                 CNN_THREAD_DATA *thread_data,
                                 CNN_MULTI_OUT *output, const float **expected,
                                 double tolerance) {
    const int num_outputs = output->num_outputs;
    const int *output_chs = output->output_channels;

    int *out_widths = (int *)aom_calloc(num_outputs, sizeof(*out_widths));
    int *out_heights = (int *)aom_calloc(num_outputs, sizeof(*out_heights));
    int *not_used = (int *)aom_calloc(num_outputs, sizeof(*not_used));
    ASSERT_NE(out_widths, nullptr);
    ASSERT_NE(out_heights, nullptr);
    ASSERT_NE(not_used, nullptr);

    av1_find_cnn_output_size(image_width, image_height, cnn_config, out_widths,
                             out_heights, not_used);
    ASSERT_TRUE(av1_cnn_predict(input, image_width, image_height, in_stride,
                                cnn_config, thread_data, output));

    int channel_offset = 0;
    for (int output_idx = 0; output_idx < num_outputs; output_idx++) {
      const float *expected_out = expected[output_idx];
      const int curr_output_chs = output_chs[output_idx];
      const int out_size = out_widths[output_idx] * out_heights[output_idx];

      double mse = 0;
      int expected_ite = 0;
      for (int channel = 0; channel < curr_output_chs; ++channel) {
        const float *buf_out = output->output_buffer[channel_offset];

        for (int i = 0; i < out_size; ++i) {
          EXPECT_NEAR(expected_out[expected_ite], buf_out[i],
                      PIXELWISE_FLOAT_TOL)
              << " output " << output_idx << " channel " << channel << " pixel "
              << expected_ite % out_size << ": " << expected_out[expected_ite]
              << "/" << buf_out[i] << std::endl;
          mse += SQR(expected_out[expected_ite] - buf_out[i]);
          expected_ite++;
        }

        channel_offset++;
      }
      mse /= (out_size * curr_output_chs);
      EXPECT_LE(mse, tolerance) << " output " << output_idx << std::endl;
    }

    aom_free(out_widths);
    aom_free(out_heights);
    aom_free(not_used);
  }